

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::compute_pca
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *axis_res,
          vec<16U,_float> *centroid_res,weighted_vec_array *vecs,vector<unsigned_int> *indices)

{
  uint uVar1;
  weighted_vec *pwVar2;
  uint i_1;
  long lVar3;
  float *pfVar4;
  row_vec *prVar5;
  float *pfVar6;
  uint i_2;
  int iVar7;
  long lVar8;
  row_vec *prVar9;
  uint i;
  ulong uVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  vec<16U,_float> centroid;
  vec<16U,_float> axis;
  vec<16U,_float> x_2;
  vec<16U,_float> prev_axis;
  vec<16U,_float> delta_axis;
  matrix<16U,_16U,_float> covar;
  
  vec<16U,_float>::set(&centroid,0.0);
  dVar13 = 0.0;
  for (uVar10 = 0; uVar10 < indices->m_size; uVar10 = uVar10 + 1) {
    uVar1 = indices->m_p[uVar10];
    pwVar2 = vecs->m_p;
    operator*(&pwVar2[uVar1].m_vec,(float)pwVar2[uVar1].m_weight);
    vec<16U,_float>::operator+=(&centroid,covar.m_rows);
    dVar13 = dVar13 + (double)pwVar2[uVar1].m_weight;
  }
  if ((dVar13 != 0.0) || (NAN(dVar13))) {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      centroid.m_s[lVar3] = (float)((double)centroid.m_s[lVar3] * (1.0 / dVar13));
    }
    matrix<16U,_16U,_float>::clear(&covar);
    for (uVar10 = 0; uVar10 < indices->m_size; uVar10 = uVar10 + 1) {
      uVar1 = indices->m_p[uVar10];
      pwVar2 = vecs->m_p;
      operator-(&pwVar2[uVar1].m_vec,&centroid);
      pfVar4 = prev_axis.m_s;
      operator*(&axis,(float)pwVar2[uVar1].m_weight);
      pfVar6 = (float *)&covar;
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        for (lVar8 = 0; lVar3 + lVar8 != 0x10; lVar8 = lVar8 + 1) {
          pfVar6[lVar8] = axis.m_s[lVar3] * pfVar4[lVar8] + pfVar6[lVar8];
        }
        pfVar6 = pfVar6 + 0x11;
        pfVar4 = pfVar4 + 1;
      }
    }
    pfVar4 = (float *)&covar;
    for (lVar3 = 0; lVar8 = -0x10, lVar3 != 0x10; lVar3 = lVar3 + 1) {
      for (; lVar3 + lVar8 != 0; lVar8 = lVar8 + 1) {
        pfVar4[lVar8 + 0x10] = (float)((double)pfVar4[lVar8 + 0x10] * (1.0 / dVar13));
      }
      pfVar4 = pfVar4 + 0x11;
    }
    pfVar4 = covar.m_rows[0].m_s + 1;
    prVar5 = covar.m_rows + 1;
    for (lVar3 = 0; prVar9 = prVar5, lVar8 = -0xf, lVar3 != 0xf; lVar3 = lVar3 + 1) {
      for (; lVar3 + lVar8 != 0; lVar8 = lVar8 + 1) {
        prVar9->m_s[0] = pfVar4[lVar8 + 0xf];
        prVar9 = prVar9 + 1;
      }
      pfVar4 = pfVar4 + 0x11;
      prVar5 = (row_vec *)(prVar5[1].m_s + 1);
    }
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      axis.m_s[lVar3] = (float)(int)lVar3 * 0.06666667 * 0.5 + 0.75;
    }
    vec<16U,_float>::vec(&prev_axis,&axis);
    iVar7 = 0;
    do {
      if (iVar7 == 10) break;
      dVar13 = 0.0;
      prVar5 = covar.m_rows;
      for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        dVar12 = 0.0;
        for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
          dVar12 = dVar12 + (double)(axis.m_s[lVar8] * ((row_vec *)prVar5->m_s)->m_s[lVar8]);
        }
        x_2.m_s[lVar3] = (float)dVar12;
        if (dVar13 <= ABS(dVar12)) {
          dVar13 = ABS(dVar12);
        }
        prVar5 = prVar5 + 1;
      }
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
        vec<16U,_float>::operator*=(&x_2,(float)(1.0 / dVar13));
      }
      operator-(&prev_axis,&x_2);
      vec<16U,_float>::operator=(&prev_axis,&axis);
      vec<16U,_float>::operator=(&axis,&x_2);
      fVar11 = vec<16U,_float>::norm(&delta_axis);
      iVar7 = iVar7 + 1;
    } while (0.0025 <= fVar11);
    vec<16U,_float>::normalize(&axis,(vec<16U,_float> *)0x0);
    vec<16U,_float>::operator=(axis_res,&axis);
  }
  else {
    axis_res->m_s[0xc] = 0.0;
    axis_res->m_s[0xd] = 0.0;
    axis_res->m_s[0xe] = 0.0;
    axis_res->m_s[0xf] = 0.0;
    axis_res->m_s[8] = 0.0;
    axis_res->m_s[9] = 0.0;
    axis_res->m_s[10] = 0.0;
    axis_res->m_s[0xb] = 0.0;
    axis_res->m_s[4] = 0.0;
    axis_res->m_s[5] = 0.0;
    axis_res->m_s[6] = 0.0;
    axis_res->m_s[7] = 0.0;
    axis_res->m_s[0] = 0.0;
    axis_res->m_s[1] = 0.0;
    axis_res->m_s[2] = 0.0;
    axis_res->m_s[3] = 0.0;
  }
  vec<16U,_float>::operator=(centroid_res,&centroid);
  return;
}

Assistant:

void compute_pca(VectorType& axis_res, VectorType& centroid_res, const weighted_vec_array& vecs, const vector<uint>& indices) {
    const uint N = VectorType::num_elements;

    VectorType centroid(0.0f);
    double total_weight = 0.0f;
    for (uint i = 0; i < indices.size(); i++) {
      const weighted_vec& v = vecs[indices[i]];
      centroid += v.m_vec * static_cast<float>(v.m_weight);
      total_weight += v.m_weight;
    }

    if (total_weight == 0.0f) {
      axis_res.clear();
      centroid_res = centroid;
      return;
    }

    double one_over_total_weight = 1.0f / total_weight;
    for (uint i = 0; i < N; i++)
      centroid[i] = static_cast<float>(centroid[i] * one_over_total_weight);

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < indices.size(); i++) {
      const weighted_vec& weighted_vec = vecs[indices[i]];

      const VectorType v(weighted_vec.m_vec - centroid);
      const VectorType w(v * static_cast<float>(weighted_vec.m_weight));

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] = static_cast<float>(covar[x][y] * one_over_total_weight);

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;
    for (uint i = 0; i < N; i++)
      axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / (N - 1)));

    VectorType prev_axis(axis);

    const uint cMaxIterations = 10;
    for (uint iter = 0; iter < cMaxIterations; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    axis_res = axis;
    centroid_res = centroid;
  }